

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks>::
move<kj::HashMap<capnp::ClientHook*,unsigned_int>::Entry,capnp::ClientHook*&>
          (HashIndex<kj::HashMap<capnp::ClientHook*,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::ClientHook_*,_unsigned_int>::Entry> table,size_t oldPos,
          size_t newPos,ClientHook **params)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  uVar2 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*params);
  lVar1 = *(long *)(this + 0x10);
  uVar3 = (ulong)((int)*(ulong *)(this + 0x18) - 1U & uVar2);
  iVar6 = (int)oldPos + 2;
  iVar5 = *(int *)(lVar1 + 4 + uVar3 * 8);
  if (iVar6 != iVar5) {
    do {
      if (iVar5 == 0) {
        kj::_::logHashTableInconsistency();
        return;
      }
      uVar4 = uVar3 + 1;
      uVar3 = uVar4 & 0xffffffff;
      if (uVar4 == *(ulong *)(this + 0x18)) {
        uVar3 = 0;
      }
      iVar5 = *(int *)(lVar1 + 4 + uVar3 * 8);
    } while (iVar6 != iVar5);
  }
  *(int *)(lVar1 + 4 + uVar3 * 8) = (int)newPos + 2;
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }